

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

CFG * __thiscall spirv_cross::Compiler::get_cfg_for_function(Compiler *this,uint32_t id)

{
  bool bVar1;
  pointer pvVar2;
  type pCVar3;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>,_false>
  local_28;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>,_false>
  local_20;
  const_iterator cfg_itr;
  uint32_t id_local;
  Compiler *this_local;
  
  cfg_itr.
  super__Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>,_false>
  ._M_cur._4_4_ = id;
  local_20._M_cur =
       (__node_type *)
       ::std::
       unordered_map<unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>_>_>
       ::find(&this->function_cfgs,
              (key_type *)
              ((long)&cfg_itr.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>,_false>
                      ._M_cur + 4));
  local_28._M_cur =
       (__node_type *)
       ::std::
       end<std::unordered_map<unsigned_int,std::unique_ptr<spirv_cross::CFG,std::default_delete<spirv_cross::CFG>>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::unique_ptr<spirv_cross::CFG,std::default_delete<spirv_cross::CFG>>>>>>
                 (&this->function_cfgs);
  bVar1 = ::std::__detail::operator!=(&local_20,&local_28);
  if (!bVar1) {
    __assert_fail("cfg_itr != end(function_cfgs)",
                  "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_cross.cpp"
                  ,0x11b7,"const CFG &spirv_cross::Compiler::get_cfg_for_function(uint32_t) const");
  }
  pvVar2 = ::std::__detail::
           _Node_const_iterator<std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>,_false,_false>
           ::operator->((_Node_const_iterator<std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>,_false,_false>
                         *)&local_20);
  bVar1 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&pvVar2->second);
  if (!bVar1) {
    __assert_fail("cfg_itr->second",
                  "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_cross.cpp"
                  ,0x11b8,"const CFG &spirv_cross::Compiler::get_cfg_for_function(uint32_t) const");
  }
  pvVar2 = ::std::__detail::
           _Node_const_iterator<std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>,_false,_false>
           ::operator->((_Node_const_iterator<std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>,_false,_false>
                         *)&local_20);
  pCVar3 = ::std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>::operator*
                     (&pvVar2->second);
  return pCVar3;
}

Assistant:

const CFG &Compiler::get_cfg_for_function(uint32_t id) const
{
	auto cfg_itr = function_cfgs.find(id);
	assert(cfg_itr != end(function_cfgs));
	assert(cfg_itr->second);
	return *cfg_itr->second;
}